

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall aeron::ClientConductor::closeAllResources(ClientConductor *this,longlong now)

{
  pointer pPVar1;
  pointer pEVar2;
  pointer pSVar3;
  ImageList *imageList;
  pointer pSVar4;
  pointer pPVar5;
  pointer pEVar6;
  shared_ptr<aeron::Publication> pub;
  __shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2> local_48;
  pthread_mutex_t *local_38;
  
  local_38 = (pthread_mutex_t *)&this->m_adminLock;
  std::recursive_mutex::lock((recursive_mutex *)&local_38->__data);
  (this->m_isClosed)._M_base._M_i = true;
  pPVar1 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar5 = (this->m_publications).
                super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
    std::__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2> *)&local_48,
               &pPVar5->m_publication);
    if (local_48._M_ptr != (element_type *)0x0) {
      *(undefined1 *)((long)&((local_48._M_ptr)->m_publicationLimit).m_impl.m_buffer.m_buffer + 4) =
           1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::clear(&this->m_publications);
  pEVar2 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar6 = (this->m_exclusivePublications).
                super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar6 != pEVar2; pEVar6 = pEVar6 + 1) {
    std::__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&pEVar6->m_publication);
    if (local_48._M_ptr != (element_type *)0x0) {
      ((local_48._M_ptr)->m_isClosed)._M_base._M_i = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::clear(&this->m_exclusivePublications);
  pSVar3 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar4 = (this->m_subscriptions).
                super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar3; pSVar4 = pSVar4 + 1) {
    std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)&local_48,
               &pSVar4->m_subscription);
    if (local_48._M_ptr != (element_type *)0x0) {
      imageList = Subscription::removeAndCloseAllImages((Subscription *)local_48._M_ptr);
      lingerAllResources(this,now,imageList);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::clear(&this->m_subscriptions);
  pthread_mutex_unlock(local_38);
  return;
}

Assistant:

void ClientConductor::closeAllResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    forceClose();

    std::for_each(m_publications.begin(), m_publications.end(),
        [&](PublicationStateDefn& entry)
        {
            std::shared_ptr<Publication> pub = entry.m_publication.lock();

            if (nullptr != pub)
            {
                pub->close();
            }
        });

    m_publications.clear();

    std::for_each(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [&](ExclusivePublicationStateDefn& entry)
        {
            std::shared_ptr<ExclusivePublication> pub = entry.m_publication.lock();

            if (nullptr != pub)
            {
                pub->close();
            }
        });

    m_exclusivePublications.clear();

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](SubscriptionStateDefn& entry)
        {
            std::shared_ptr<Subscription> sub = entry.m_subscription.lock();

            if (nullptr != sub)
            {
                lingerAllResources(now, sub->removeAndCloseAllImages());
            }
        });

    m_subscriptions.clear();
}